

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

int Ssc_GiaSimulatePatternFraig_rec(Ssc_Man_t *p,int iFraigObj)

{
  sat_solver *s;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj_00;
  int Res1;
  int Res0;
  Gia_Obj_t *pObj;
  int iFraigObj_local;
  Ssc_Man_t *p_local;
  
  iVar1 = Ssc_ObjSatVar(p,iFraigObj);
  if (iVar1 == 0) {
    pObj_00 = Gia_ManObj(p->pFraig,iFraigObj);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscCore.c"
                    ,0xab,"int Ssc_GiaSimulatePatternFraig_rec(Ssc_Man_t *, int)");
    }
    iVar1 = Gia_ObjFaninId0(pObj_00,iFraigObj);
    uVar2 = Ssc_GiaSimulatePatternFraig_rec(p,iVar1);
    iVar1 = Gia_ObjFaninId1(pObj_00,iFraigObj);
    uVar3 = Ssc_GiaSimulatePatternFraig_rec(p,iVar1);
    uVar4 = Gia_ObjFaninC0(pObj_00);
    uVar5 = Gia_ObjFaninC1(pObj_00);
    *(ulong *)pObj_00 =
         *(ulong *)pObj_00 & 0xffffffffbfffffff |
         ((ulong)((uVar2 ^ uVar4) & (uVar3 ^ uVar5)) & 1) << 0x1e;
    p_local._4_4_ = (uint)(*(ulong *)pObj_00 >> 0x1e) & 1;
  }
  else {
    s = p->pSat;
    iVar1 = Ssc_ObjSatVar(p,iFraigObj);
    p_local._4_4_ = sat_solver_var_value(s,iVar1);
  }
  return p_local._4_4_;
}

Assistant:

int Ssc_GiaSimulatePatternFraig_rec( Ssc_Man_t * p, int iFraigObj )
{
    Gia_Obj_t * pObj;
    int Res0, Res1;
    if ( Ssc_ObjSatVar(p, iFraigObj) )
        return sat_solver_var_value( p->pSat, Ssc_ObjSatVar(p, iFraigObj) );
    pObj = Gia_ManObj( p->pFraig, iFraigObj );
    assert( Gia_ObjIsAnd(pObj) );
    Res0 = Ssc_GiaSimulatePatternFraig_rec( p, Gia_ObjFaninId0(pObj, iFraigObj) );
    Res1 = Ssc_GiaSimulatePatternFraig_rec( p, Gia_ObjFaninId1(pObj, iFraigObj) );
    pObj->fMark0 = (Res0 ^ Gia_ObjFaninC0(pObj)) & (Res1 ^ Gia_ObjFaninC1(pObj));
    return pObj->fMark0;
}